

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::~cmake(cmake *this)

{
  cmake *this_local;
  
  std::unique_ptr<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>::
  ~unique_ptr(&this->ProfilingOutput);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            (&this->GlobalGenerator);
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack(&this->CheckInProgressMessages);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->DebugFindVars);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->DebugFindPkgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->TraceOnlyThisSources);
  std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::~unique_ptr(&this->Messenger);
  std::unique_ptr<cmState,_std::default_delete<cmState>_>::~unique_ptr(&this->State);
  std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr(&this->FileAPI);
  std::unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_>::~unique_ptr
            (&this->VariableWatch);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~map(&this->UnprocessedPresetEnvironment);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::~map(&this->UnprocessedPresetVariables);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::~map(&this->InstalledFiles);
  std::__cxx11::string::~string((string *)&this->GraphVizFile);
  std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::~unique_ptr
            (&this->FileTimeCache);
  FileExtensions::~FileExtensions(&this->HipFileExtensions);
  FileExtensions::~FileExtensions(&this->FortranFileExtensions);
  FileExtensions::~FileExtensions(&this->ISPCFileExtensions);
  FileExtensions::~FileExtensions(&this->CudaFileExtensions);
  FileExtensions::~FileExtensions(&this->HeaderFileExtensions);
  FileExtensions::~FileExtensions(&this->CLikeSourceFileExtensions);
  std::__cxx11::string::~string((string *)&this->EnvironmentGenerator);
  std::__cxx11::string::~string((string *)&this->VSSolutionFile);
  std::__cxx11::string::~string((string *)&this->CheckStampList);
  std::__cxx11::string::~string((string *)&this->CheckStampFile);
  std::__cxx11::string::~string((string *)&this->CheckBuildSystemArgument);
  std::__cxx11::string::~string((string *)&this->CCEnvironment);
  std::__cxx11::string::~string((string *)&this->CXXEnvironment);
  std::__cxx11::string::~string((string *)&this->CMakeEditCommand);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map(&this->UsedCliVariables);
  cmGeneratedFileStream::~cmGeneratedFileStream(&this->TraceFile);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&this->ProgressCallback);
  std::__cxx11::string::~string((string *)&this->CMakeWorkingDirectory);
  std::__cxx11::string::~string((string *)&this->GeneratorToolset);
  std::__cxx11::string::~string((string *)&this->GeneratorPlatform);
  std::__cxx11::string::~string((string *)&this->GeneratorInstance);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  ::~map(&this->DiagLevels);
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::~vector(&this->ExtraGenerators);
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ::~vector(&this->Generators);
  return;
}

Assistant:

cmake::~cmake() = default;